

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mplayer.c
# Opt level: O0

void get_mplname(monst *mtmp,char *nam)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  char *devnam;
  boolean fmlkind;
  char *nam_local;
  monst *mtmp_local;
  
  bVar4 = (mtmp->data->mflags2 & 0x20000) != 0;
  pcVar3 = dev_name();
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "Adam";
    if (bVar4) {
      pcVar3 = "Eve";
    }
    strcpy(nam,pcVar3);
  }
  else if ((bVar4) && (iVar2 = strcmp(pcVar3,"Janet"), iVar2 != 0)) {
    iVar2 = rn2(2);
    pcVar3 = "Eve";
    if (iVar2 != 0) {
      pcVar3 = "Maud";
    }
    strcpy(nam,pcVar3);
  }
  else {
    strcpy(nam,pcVar3);
  }
  if ((bVar4) || (iVar2 = strcmp(nam,"Janet"), iVar2 == 0)) {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfffffffe | 1;
  }
  else {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfffffffe;
  }
  strcat(nam," the ");
  bVar1 = mtmp->m_lev;
  iVar2 = monsndx(mtmp->data);
  pcVar3 = rank_of((uint)bVar1,(short)iVar2,(byte)*(undefined4 *)&mtmp->field_0x60 & 1);
  strcat(nam,pcVar3);
  return;
}

Assistant:

static void get_mplname(struct monst *mtmp, char *nam)
{
	boolean fmlkind = is_female(mtmp->data);
	const char *devnam;

	devnam = dev_name();
	if (!devnam)
	    strcpy(nam, fmlkind ? "Eve" : "Adam");
	else if (fmlkind && !!strcmp(devnam, "Janet"))
	    strcpy(nam, rn2(2) ? "Maud" : "Eve");
	else strcpy(nam, devnam);

	if (fmlkind || !strcmp(nam, "Janet"))
	    mtmp->female = 1;
	else
	    mtmp->female = 0;
	strcat(nam, " the ");
	strcat(nam, rank_of((int)mtmp->m_lev, monsndx(mtmp->data), mtmp->female));
}